

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O2

int stbsp__real_to_str(char **start,uint *len,char *out,int *decimal_pos,double value,
                      uint frac_digits)

{
  uint uVar1;
  int cn;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  double *pdVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_90;
  uint local_88 [2];
  double local_80;
  double local_78;
  double local_70 [2];
  longlong bt;
  longlong bt_2;
  double bhi;
  double ahi;
  double d;
  
  bt_2 = 0;
  bhi = value;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)&bt_2 + lVar3) = *(undefined1 *)((long)&bhi + lVar3);
  }
  uVar1 = (uint)((ulong)bt_2 >> 0x20);
  uVar8 = uVar1 >> 0x14 & 0x7ff;
  if (bt_2 < 0) {
    value = -value;
    bhi = value;
  }
  if (uVar8 == 0) {
    if ((bt_2 & 0x7fffffffffffffffU) == 0) {
      *decimal_pos = 1;
      *start = out;
      *out = '0';
      uVar8 = 1;
      goto LAB_001087b9;
    }
    uVar8 = 0;
    for (uVar4 = 0x8000000000000; (uVar4 & bt_2) == 0; uVar4 = uVar4 >> 1) {
      uVar8 = uVar8 - 1;
    }
  }
  else if (uVar8 == 0x7ff) {
    pcVar6 = "NaN";
    if ((bt_2 & 0xfffffffffffffU) == 0) {
      pcVar6 = "Inf";
    }
    *start = pcVar6;
    *decimal_pos = 0x7000;
    uVar8 = 3;
    goto LAB_001087b9;
  }
  if ((int)uVar8 < 0x3ff) {
    iVar15 = -((uVar8 - 0x3ff) * -0x269 >> 0xb);
  }
  else {
    iVar15 = ((uVar8 - 0x3ff) * 0x4d1 >> 0xc) + 1;
  }
  ahi = (double)bt_2;
  uVar8 = 0x12 - iVar15;
  local_70[0] = value;
  if (uVar8 < 0x17) {
    local_78 = 0.0;
    local_80 = 0.0;
    dVar19 = stbsp__bot[uVar8];
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      *(undefined1 *)((long)local_88 + lVar3 + -8) = *(undefined1 *)((long)local_70 + lVar3);
    }
    local_90 = (double)((ulong)local_90 & 0xfffffffff8000000);
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      *(undefined1 *)((long)local_70 + lVar3 + -8) = *(undefined1 *)((long)local_88 + lVar3 + -8);
    }
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      *(undefined1 *)((long)local_88 + lVar3 + -8) =
           *(undefined1 *)((long)(stbsp__bot + uVar8) + lVar3);
    }
    local_90 = (double)((ulong)local_90 & 0xfffffffff8000000);
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      *(undefined1 *)((long)&local_80 + lVar3) = *(undefined1 *)((long)local_88 + lVar3 + -8);
    }
    dVar21 = value * dVar19;
    dVar19 = dVar19 - local_80;
    dVar19 = dVar19 * (value - local_78) +
             local_80 * (value - local_78) + local_78 * dVar19 + (local_78 * local_80 - dVar21);
  }
  else {
    uVar11 = -uVar8;
    if (0 < (int)uVar8) {
      uVar11 = uVar8;
    }
    uVar2 = uVar11 * 0x2c9 >> 0xe;
    uVar8 = 0xd;
    if (uVar2 < 0xd) {
      uVar8 = uVar2;
    }
    iVar10 = uVar8 * -0x17 + uVar11;
    uVar4 = (ulong)uVar8;
    if (iVar15 < 0x13) {
      if (iVar10 == 0) {
        dVar19 = 0.0;
        dVar21 = value;
      }
      else {
        iVar9 = 0x16;
        if (iVar10 < 0x16) {
          iVar9 = iVar10;
        }
        local_78 = 0.0;
        local_80 = 0.0;
        dVar19 = stbsp__bot[iVar9];
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3 + -8) = *(undefined1 *)((long)local_70 + lVar3);
        }
        local_90 = (double)((ulong)local_90 & 0xfffffffff8000000);
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_70 + lVar3 + -8) =
               *(undefined1 *)((long)local_88 + lVar3 + -8);
        }
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3 + -8) =
               *(undefined1 *)((long)(stbsp__bot + iVar9) + lVar3);
        }
        dVar21 = value * dVar19;
        local_90 = (double)((ulong)local_90 & 0xfffffffff8000000);
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)&local_80 + lVar3) = *(undefined1 *)((long)local_88 + lVar3 + -8);
        }
        dVar19 = dVar19 - local_80;
        dVar19 = dVar19 * (value - local_78) +
                 local_80 * (value - local_78) + local_78 * dVar19 + (local_78 * local_80 - dVar21);
        if (0x16 < iVar10) {
          local_78 = dVar21 + dVar19;
          local_80 = 0.0;
          local_90 = 0.0;
          dVar18 = stbsp__bot[iVar10 - iVar9];
          for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
            *(undefined1 *)((long)local_88 + lVar3) = *(undefined1 *)((long)local_70 + lVar3 + -8);
          }
          local_88[0] = local_88[0] & 0xf8000000;
          for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
            *(undefined1 *)((long)&local_80 + lVar3) = *(undefined1 *)((long)local_88 + lVar3);
          }
          for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
            *(undefined1 *)((long)local_88 + lVar3) =
                 *(undefined1 *)((long)(stbsp__bot + (iVar10 - iVar9)) + lVar3);
          }
          local_88[0] = local_88[0] & 0xf8000000;
          for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
            *(undefined1 *)((long)local_88 + lVar3 + -8) = *(undefined1 *)((long)local_88 + lVar3);
          }
          dVar19 = (dVar19 - (local_78 - dVar21)) * dVar18 +
                   (dVar18 - local_90) * (local_78 - local_80) +
                   local_90 * (local_78 - local_80) +
                   local_80 * (dVar18 - local_90) + (local_80 * local_90 - local_78 * dVar18);
          dVar21 = local_78 * dVar18;
        }
      }
      if (0x16 < uVar11) {
        local_78 = dVar21 + dVar19;
        local_80 = 0.0;
        local_90 = 0.0;
        dVar18 = *(double *)(&DAT_0010b858 + uVar4 * 8);
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3) = *(undefined1 *)((long)local_70 + lVar3 + -8);
        }
        dVar20 = local_78 - dVar21;
        local_88[0] = local_88[0] & 0xf8000000;
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)&local_80 + lVar3) = *(undefined1 *)((long)local_88 + lVar3);
        }
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined *)((long)local_88 + lVar3) =
               *(undefined *)((long)(&DAT_0010b858 + uVar4 * 8) + lVar3);
        }
        local_88[0] = local_88[0] & 0xf8000000;
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3 + -8) = *(undefined1 *)((long)local_88 + lVar3);
        }
        dVar21 = local_78 * dVar18;
        dVar19 = (dVar19 - dVar20) * dVar18;
        dVar20 = local_90 * (local_78 - local_80) +
                 local_80 * (dVar18 - local_90) + (local_80 * local_90 - dVar21);
        dVar18 = (dVar18 - local_90) * (local_78 - local_80);
        pdVar7 = stbsp__toperr;
        goto LAB_00108571;
      }
    }
    else {
      if (iVar10 == 0) {
        dVar19 = 0.0;
      }
      else {
        local_78 = 0.0;
        local_80 = 0.0;
        dVar21 = *(double *)(&DAT_0010b618 + (long)iVar10 * 8);
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3 + -8) = *(undefined1 *)((long)local_70 + lVar3);
        }
        local_90 = (double)((ulong)local_90 & 0xfffffffff8000000);
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_70 + lVar3 + -8) =
               *(undefined1 *)((long)local_88 + lVar3 + -8);
        }
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined *)((long)local_88 + lVar3 + -8) =
               *(undefined *)((long)(&DAT_0010b618 + (long)iVar10 * 8) + lVar3);
        }
        local_90 = (double)((ulong)local_90 & 0xfffffffff8000000);
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)&local_80 + lVar3) = *(undefined1 *)((long)local_88 + lVar3 + -8);
        }
        dVar18 = value * dVar21;
        dVar21 = dVar21 - local_80;
        dVar19 = value * stbsp__negboterr[(long)iVar10 + -1] +
                 dVar21 * (value - local_78) +
                 local_80 * (value - local_78) + local_78 * dVar21 + (local_78 * local_80 - dVar18);
        value = dVar18;
      }
      dVar21 = value;
      if (0x16 < uVar11) {
        local_78 = value + dVar19;
        local_80 = 0.0;
        local_90 = 0.0;
        dVar18 = stbsp__negboterr[uVar4 + 0x15];
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3) = *(undefined1 *)((long)local_70 + lVar3 + -8);
        }
        local_88[0] = local_88[0] & 0xf8000000;
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)&local_80 + lVar3) = *(undefined1 *)((long)local_88 + lVar3);
        }
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3) =
               *(undefined1 *)((long)(stbsp__negboterr + uVar4 + 0x15) + lVar3);
        }
        local_88[0] = local_88[0] & 0xf8000000;
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          *(undefined1 *)((long)local_88 + lVar3 + -8) = *(undefined1 *)((long)local_88 + lVar3);
        }
        dVar21 = local_78 * dVar18;
        dVar19 = (dVar19 - (local_78 - value)) * dVar18;
        dVar20 = local_90 * (local_78 - local_80) +
                 local_80 * (dVar18 - local_90) + (local_80 * local_90 - dVar21);
        dVar18 = (dVar18 - local_90) * (local_78 - local_80);
        pdVar7 = stbsp__negtoperr;
LAB_00108571:
        dVar19 = local_78 * pdVar7[uVar4 - 1] + dVar19 + dVar18 + dVar20;
      }
    }
  }
  dVar20 = dVar21 + dVar19;
  dVar18 = (double)(long)dVar20;
  dVar22 = dVar20 - dVar18;
  uVar4 = (long)(((dVar20 - (dVar22 - (dVar22 - dVar20))) - ((dVar22 - dVar20) + dVar18)) + dVar22 +
                (dVar19 - (dVar20 - dVar21))) + (long)dVar20;
  iVar15 = iVar15 + (uint)(999999999999999999 < uVar4);
  uVar8 = iVar15 + frac_digits;
  if ((int)frac_digits < 0) {
    uVar8 = (frac_digits & 0x7ffffff) + 1;
  }
  if (uVar8 < 0x18) {
    uVar11 = (uint)(999999999 < uVar4) * 9;
    puVar12 = stbsp__powten + (ulong)uVar11 + 1;
    uVar11 = ~uVar11;
    do {
      if (uVar4 < *puVar12) {
        if ((uVar8 < -uVar11) && (-(uVar8 + uVar11) < 0x18)) {
          uVar4 = (stbsp__powten[-(uVar8 + uVar11)] >> 1) + uVar4;
          iVar15 = (iVar15 + 1) - (uint)(uVar4 < *puVar12);
          uVar4 = uVar4 / stbsp__powten[-(uVar8 + uVar11)];
        }
        break;
      }
      uVar11 = uVar11 - 1;
      puVar12 = puVar12 + 1;
    } while (uVar11 != 0xffffffec);
  }
  if (uVar4 == 0) {
    uVar13 = 0;
  }
  else {
    do {
      uVar13 = uVar4;
      uVar4 = uVar13;
      if ((long)uVar13 < 0x100000000) goto LAB_001086a2;
      uVar4 = uVar13 / 1000;
    } while (uVar13 % 1000 == 0);
  }
LAB_001086b6:
  pcVar6 = out + 0x3f;
  iVar10 = -8;
  iVar9 = 0;
  while( true ) {
    if ((long)uVar13 < 100000000) {
      uVar4 = uVar13;
      uVar13 = 0;
    }
    else {
      uVar4 = uVar13 % 100000000;
      uVar13 = uVar13 / 100000000;
    }
    lVar16 = -8;
    lVar3 = 0;
    pcVar17 = pcVar6;
    for (; (int)uVar4 != 0; uVar4 = (uVar4 & 0xffffffff) / 100) {
      *(undefined2 *)(out + lVar3 + 0x3e) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + ((uVar4 & 0xffffffff) % 100) * 2);
      lVar3 = lVar3 + -2;
      lVar16 = lVar16 + 2;
      pcVar17 = pcVar17 + -2;
    }
    if (uVar13 == 0) break;
    for (; lVar16 != 0; lVar16 = lVar16 + 1) {
      *pcVar17 = '0';
      pcVar17 = pcVar17 + -1;
    }
    iVar9 = iVar9 + 8;
    iVar10 = iVar10 + 8;
    out = out + -8;
    pcVar6 = pcVar6 + -8;
  }
  pcVar6 = out + lVar3 + 0x40;
  uVar8 = 0;
  iVar14 = (int)lVar3;
  if (iVar14 != iVar9) {
    if (*pcVar6 == '0') {
      pcVar6 = out + lVar3 + 0x41;
      uVar8 = (iVar10 - iVar14) + 7;
    }
    else {
      uVar8 = iVar9 - iVar14;
    }
  }
  *decimal_pos = iVar15;
  *start = pcVar6;
LAB_001087b9:
  *len = uVar8;
  return (int)uVar1 >> 0x1f;
LAB_001086a2:
  do {
    uVar13 = uVar4 & 0xffffffff;
    uVar5 = uVar4 & 0xffffffff;
    uVar4 = uVar5 / 1000;
  } while ((int)(uVar5 % 1000) == 0);
  goto LAB_001086b6;
}

Assistant:

static stbsp__int32 stbsp__real_to_str(char const **start, stbsp__uint32 *len, char *out, stbsp__int32 *decimal_pos, double value, stbsp__uint32 frac_digits)
{
   double d;
   stbsp__int64 bits = 0;
   stbsp__int32 expo, e, ng, tens;

   d = value;
   STBSP__COPYFP(bits, d);
   expo = (stbsp__int32)((bits >> 52) & 2047);
   ng = (stbsp__int32)(bits >> 63);
   if (ng)
      d = -d;

   if (expo == 2047) // is nan or inf?
   {
      *start = (bits & ((((stbsp__uint64)1) << 52) - 1)) ? "NaN" : "Inf";
      *decimal_pos = STBSP__SPECIAL;
      *len = 3;
      return ng;
   }

   if (expo == 0) // is zero or denormal
   {
      if ((bits << 1) == 0) // do zero
      {
         *decimal_pos = 1;
         *start = out;
         out[0] = '0';
         *len = 1;
         return ng;
      }
      // find the right expo for denormals
      {
         stbsp__int64 v = ((stbsp__uint64)1) << 51;
         while ((bits & v) == 0) {
            --expo;
            v >>= 1;
         }
      }
   }

   // find the decimal exponent as well as the decimal bits of the value
   {
      double ph, pl;

      // log10 estimate - very specifically tweaked to hit or undershoot by no more than 1 of log10 of all expos 1..2046
      tens = expo - 1023;
      tens = (tens < 0) ? ((tens * 617) / 2048) : (((tens * 1233) / 4096) + 1);

      // move the significant bits into position and stick them into an int
      stbsp__raise_to_power10(&ph, &pl, d, 18 - tens);

      // get full as much precision from double-double as possible
      stbsp__ddtoS64(bits, ph, pl);

      // check if we undershot
      if (((stbsp__uint64)bits) >= stbsp__tento19th)
         ++tens;
   }

   // now do the rounding in integer land
   frac_digits = (frac_digits & 0x80000000) ? ((frac_digits & 0x7ffffff) + 1) : (tens + frac_digits);
   if ((frac_digits < 24)) {
      stbsp__uint32 dg = 1;
      if ((stbsp__uint64)bits >= stbsp__powten[9])
         dg = 10;
      while ((stbsp__uint64)bits >= stbsp__powten[dg]) {
         ++dg;
         if (dg == 20)
            goto noround;
      }
      if (frac_digits < dg) {
         stbsp__uint64 r;
         // add 0.5 at the right position and round
         e = dg - frac_digits;
         if ((stbsp__uint32)e >= 24)
            goto noround;
         r = stbsp__powten[e];
         bits = bits + (r / 2);
         if ((stbsp__uint64)bits >= stbsp__powten[dg])
            ++tens;
         bits /= r;
      }
   noround:;
   }

   // kill long trailing runs of zeros
   if (bits) {
      stbsp__uint32 n;
      for (;;) {
         if (bits <= 0xffffffff)
            break;
         if (bits % 1000)
            goto donez;
         bits /= 1000;
      }
      n = (stbsp__uint32)bits;
      while ((n % 1000) == 0)
         n /= 1000;
      bits = n;
   donez:;
   }

   // convert to string
   out += 64;
   e = 0;
   for (;;) {
      stbsp__uint32 n;
      char *o = out - 8;
      // do the conversion in chunks of U32s (avoid most 64-bit divides, worth it, constant denomiators be damned)
      if (bits >= 100000000) {
         n = (stbsp__uint32)(bits % 100000000);
         bits /= 100000000;
      } else {
         n = (stbsp__uint32)bits;
         bits = 0;
      }
      while (n) {
         out -= 2;
         *(stbsp__uint16 *)out = *(stbsp__uint16 *)&stbsp__digitpair[(n % 100) * 2];
         n /= 100;
         e += 2;
      }
      if (bits == 0) {
         if ((e) && (out[0] == '0')) {
            ++out;
            --e;
         }
         break;
      }
      while (out != o) {
         *--out = '0';
         ++e;
      }
   }

   *decimal_pos = tens;
   *start = out;
   *len = e;
   return ng;
}